

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O3

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::reserve
          (CompressedStorage<double,_int> *this,Index size)

{
  Scalar *__src;
  Scalar *__dest;
  StorageIndex *__dest_00;
  ulong uVar1;
  StorageIndex *__src_00;
  ulong uVar2;
  
  uVar2 = this->m_size;
  uVar1 = size + uVar2;
  if (this->m_allocatedSize < (long)uVar1) {
    __dest = (Scalar *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    __dest_00 = (StorageIndex *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    if ((long)uVar1 <= (long)uVar2) {
      uVar2 = uVar1;
    }
    __src = this->m_values;
    if ((long)uVar2 < 1) {
      __src_00 = this->m_indices;
    }
    else {
      memcpy(__dest,__src,uVar2 * 8);
      __src_00 = this->m_indices;
      memcpy(__dest_00,__src_00,uVar2 << 2);
    }
    this->m_values = __dest;
    this->m_indices = __dest_00;
    this->m_allocatedSize = uVar1;
    if (__src_00 != (StorageIndex *)0x0) {
      operator_delete__(__src_00);
    }
    if (__src != (Scalar *)0x0) {
      operator_delete__(__src);
      return;
    }
  }
  return;
}

Assistant:

void reserve(Index size)
    {
      Index newAllocatedSize = m_size + size;
      if (newAllocatedSize > m_allocatedSize)
        reallocate(newAllocatedSize);
    }